

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biffopen(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  runsdef *prVar2;
  ushort *puVar3;
  appctxdef *paVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  FILE *pFVar8;
  errcxdef *peVar9;
  byte bVar10;
  biffildef *pbVar11;
  ushort *puVar12;
  char *__modes;
  runcxdef *ctx_00;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  char fname [4096];
  char newname [4096];
  char acStack_2028 [4096];
  char local_1028 [4096];
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  if (prVar2[-1].runstyp != '\x03') {
    peVar9 = ctx->bifcxrun->runcxerr;
LAB_00213555:
    peVar9->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  bifcstr(ctx,acStack_2028,0x1000,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
  iVar6 = os_is_file_absolute(acStack_2028);
  if (iVar6 == 0) {
    os_build_full_path(local_1028,0x1000,ctx->bifcxrun->runcxgamepath,acStack_2028);
    strcpy(acStack_2028,local_1028);
  }
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x03') {
    peVar9 = ctx_00->runcxerr;
    goto LAB_00213555;
  }
  puVar3 = (ushort *)(ctx_00->runcxsp->runsv).runsvstr;
  uVar1 = *puVar3;
  if (uVar1 < 3) goto LAB_00213519;
  pbVar11 = ctx->bifcxfile;
  uVar13 = 0;
  do {
    if (pbVar11->fp == (osfildef *)0x0) goto LAB_00213319;
    uVar13 = uVar13 + 1;
    pbVar11 = pbVar11 + 1;
  } while (uVar13 != 10);
  uVar13 = 10;
LAB_00213319:
  if ((int)uVar13 == 10) goto LAB_00213504;
  bVar10 = (byte)puVar3[1];
  iVar6 = 0x77;
  if (bVar10 < 0x72) {
    if (bVar10 == 0x52) {
LAB_0021334e:
      iVar6 = 0x72;
    }
    else if (bVar10 != 0x57) goto LAB_00213519;
  }
  else if (bVar10 != 0x77) {
    if (bVar10 != 0x72) goto LAB_00213519;
    goto LAB_0021334e;
  }
  puVar12 = (ushort *)((long)puVar3 + 3);
  iVar7 = 0;
  bVar5 = true;
  if (uVar1 != 3) {
    if (*(char *)puVar12 == '+') {
      puVar12 = puVar3 + 2;
      iVar7 = uVar1 - 4;
      bVar5 = false;
    }
    else {
      iVar7 = uVar1 - 3;
    }
  }
  if (iVar7 < 1) {
    uVar14 = 0;
    bVar15 = false;
  }
  else {
    bVar10 = (char)*puVar12 + 0xbe;
    if ((0x32 < bVar10) || ((0x4000100040001U >> ((ulong)bVar10 & 0x3f) & 1) == 0))
    goto LAB_00213519;
    uVar14 = 0x4000000040000 >> (bVar10 & 0x3f);
    bVar15 = iVar7 != 1;
  }
  if (bVar15) goto LAB_00213519;
  paVar4 = ctx->bifcxappctx;
  if ((paVar4 != (appctxdef *)0x0) &&
     (paVar4->get_io_safety_level != (_func_void_void_ptr_int_ptr_int_ptr *)0x0)) {
    (*paVar4->get_io_safety_level)
              (paVar4->io_safety_level_ctx,&ctx->bifcxsafetyr,&ctx->bifcxsafetyw);
  }
  iVar7 = os_is_file_in_dir(acStack_2028,ctx->bifcxrun->runcxgamepath,1,0);
  if (iVar6 == 0x72) {
    if (ctx->bifcxsafetyr < 4) {
      bVar15 = ctx->bifcxsafetyr < 2;
LAB_00213453:
      if ((bool)(bVar15 | iVar7 != 0)) {
        if (iVar6 == 0x72) {
          if ((uVar14 & 1) != 0) {
            if (!bVar5) goto LAB_00213519;
            __modes = "r";
            goto LAB_002134cb;
          }
          if (bVar5) {
            __modes = "rb";
            goto LAB_002134cb;
          }
          pFVar8 = (FILE *)osfoprwb(acStack_2028,4);
        }
        else {
          if (iVar6 != 0x77) {
LAB_00213519:
            ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "fopen";
            ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
            runsign(ctx->bifcxrun,0x400);
          }
          if ((uVar14 & 1) == 0) {
            if (bVar5) {
              __modes = "wb";
            }
            else {
              __modes = "w+b";
            }
          }
          else {
            if (!bVar5) goto LAB_00213519;
            __modes = "w";
          }
LAB_002134cb:
          pFVar8 = fopen(acStack_2028,__modes);
        }
        if (pFVar8 != (FILE *)0x0) {
          uVar13 = uVar13 & 0xffffffff;
          ctx->bifcxfile[uVar13].flags = (byte)~(byte)uVar14 & 1;
          ctx->bifcxfile[uVar13].fp = (osfildef *)pFVar8;
          runpnum(ctx->bifcxrun,uVar13);
          return;
        }
      }
    }
  }
  else {
    if (iVar6 != 0x77) goto LAB_00213519;
    if (ctx->bifcxsafetyw < 3) {
      bVar15 = ctx->bifcxsafetyw < 1;
      goto LAB_00213453;
    }
  }
  ctx_00 = ctx->bifcxrun;
LAB_00213504:
  runpnil(ctx_00);
  return;
}

Assistant:

void biffopen(bifcxdef *ctx, int argc)
{
    char      fname[OSFNMAX];
    uchar    *p;
    uchar    *mode;
    int       modelen;
    int       fnum;
    osfildef *fp;
    int       bin_mode = TRUE;   /* flag: mode is binary (rather than text) */
    int       rw_mode = FALSE;     /* flag: both read and write are allowed */
    char      main_mode;                     /* 'r' for read, 'w' for write */
    int       in_same_dir;            /* flag: file is in current directory */
    appctxdef *appctx;
    
    bifcntargs(ctx, 2, argc);

    /* get the filename */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, fname, (size_t)sizeof(fname), p);

    /* 
     *   If it's a relative path, combine it with the game file path to form
     *   the absolute path.  This ensures that relative paths are always
     *   relative to the original working directory if the OS-level working
     *   directory has changed. 
     */
    if (!os_is_file_absolute(fname))
    {
        /* combine the game file path with the relative filename */
        char newname[OSFNMAX];
        os_build_full_path(newname, sizeof(newname),
                           ctx->bifcxrun->runcxgamepath, fname);

        /* replace the original filename with the full path */
        strcpy(fname, newname);
    }

    /* get the mode string */
    mode = runpopstr(ctx->bifcxrun);
    modelen = osrp2(mode) - 2;
    mode += 2;
    if (modelen < 1)
        goto bad_mode;

    /* allocate a filenum for the file */
    for (fnum = 0 ; fnum < BIFFILMAX ; ++fnum)
    {
        if (ctx->bifcxfile[fnum].fp == 0)
            break;
    }
    if (fnum == BIFFILMAX)
    {
        /* return nil to indicate failure */
        runpnil(ctx->bifcxrun);
        return;
    }

    /* parse the main mode */
    switch(*mode)
    {
    case 'w':
    case 'W':
        main_mode = 'w';
        break;

    case 'r':
    case 'R':
        main_mode = 'r';
        break;

    default:
        goto bad_mode;
    }

    /* skip the main mode, and check for a '+' flag */
    ++mode;
    --modelen;
    if (modelen > 0 && *mode == '+')
    {
        /* note the read/write mode */
        rw_mode = TRUE;

        /* skip the speciifer */
        ++mode;
        --modelen;
    }

    /* check for a binary/text specifier */
    if (modelen > 0)
    {
        switch(*mode)
        {
        case 'b':
        case 'B':
            bin_mode = TRUE;
            break;

        case 't':
        case 'T':
            bin_mode = FALSE;
            break;

        default:
            goto bad_mode;
        }

        /* skip the binary/text specifier */
        ++mode;
        --modelen;
    }

    /* it's an error if there's anything left unparsed */
    if (modelen > 0)
        goto bad_mode;

    /*
     *   If we have a host application context, and it provides a file
     *   safety level callback function, ask the host system for its
     *   current file safety level, which overrides our current setting.  
     */
    appctx = ctx->bifcxappctx;
    if (appctx != 0 && appctx->get_io_safety_level != 0)
    {
        /* 
         *   ask the host system for the current level, and override any
         *   setting we previously had 
         */
        (*appctx->get_io_safety_level)(
            appctx->io_safety_level_ctx,
            &ctx->bifcxsafetyr, &ctx->bifcxsafetyw);
    }

    /* 
     *   Check to see if the file is in the current working directory - if
     *   not, we may have to disallow the operation based on safety level
     *   settings.
     */
    in_same_dir = os_is_file_in_dir(
        fname, ctx->bifcxrun->runcxgamepath, TRUE, FALSE);

    /* check file safety settings */
    switch(main_mode)
    {
    case 'w':
        /* 
         *   writing - we must be at a safety level no higher than 2
         *   (read/write current directory) to write at all, and we must be
         *   level 0 to write a file that's not in the current directory 
         */
        if (ctx->bifcxsafetyw > 2
            || (!in_same_dir && ctx->bifcxsafetyw > 0))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    case 'r':
        /*
         *   reading - we must be at a safety level no higher than 3 (read
         *   current directory) to read at all, and we must be at safety
         *   level 1 (read any directory) or lower to read a file that's not
         *   in the current directory 
         */
        if (ctx->bifcxsafetyr > 3
            || (!in_same_dir && ctx->bifcxsafetyr > 1))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    default:
        /* 
         *   fail the operation, as a code maintenance measure to make
         *   sure that we add appropriate cases to this switch (even if
         *   merely to allow the operation unconditionally) in the event
         *   that more modes are added in the future 
         */
        goto bad_mode;
    }

    /* try opening the file */
    switch(main_mode)
    {
    case 'w':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /* 
             *   binary mode -- allow read/write or just writing, but in
             *   either case truncate the file if it already exists, and
             *   create a new file if it doesn't exist 
             */
            if (rw_mode)
                fp = osfoprwtb(fname, OSFTDATA);
            else
                fp = osfopwb(fname, OSFTDATA);
        }
        else
        {
            /* text mode - don't allow read/write on a text file */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfopwt(fname, OSFTTEXT);
        }
        break;

    case 'r':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /*
             *   Binary mode -- allow read/write or just reading; leave
             *   any existing file intact.
             */
            if (rw_mode)
            {
                /* open for reading and writing, keeping existing data */
                fp = osfoprwb(fname, OSFTDATA);
            }
            else
            {
                /* open for read-only */
                fp = osfoprb(fname, OSFTDATA);
            }
        }
        else
        {
            /* text mode -- only allow reading */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfoprt(fname, OSFTTEXT);
        }
        break;

    default:
        goto bad_mode;
    }

    /* if we couldn't open it, return nil */
    if (fp == 0)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* store the flags */
    ctx->bifcxfile[fnum].flags = 0;
    if (bin_mode)
        ctx->bifcxfile[fnum].flags |= BIFFIL_F_BINARY;

    /* remember the file handle */
    ctx->bifcxfile[fnum].fp = fp;

    /* return the file number (i.e., the slot number) */
    runpnum(ctx->bifcxrun, (long)fnum);
    return;


    /* come here on a mode error */
bad_mode:
    runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "fopen");
}